

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::setupSharedStorageBuffers
          (TextureCubeMapArraySamplingTest *this,formatDefinition *format,
          samplingFunction *sampling_function,bufferCollection *buffers,GLuint program_id)

{
  samplerType sVar1;
  ulong uVar2;
  undefined **ppuVar3;
  long lVar4;
  attributeDefinition *attribute;
  
  sVar1 = format->m_sampler_type;
  uVar2 = (ulong)*sampling_function;
  ppuVar3 = (undefined **)buffers;
  if (uVar2 < 4) {
    lVar4 = *(long *)(&DAT_01b74ee0 + uVar2 * 8);
    ppuVar3 = &PTR_texture_attributes_02109e00;
    attribute = (attributeDefinition *)(&PTR_texture_attributes_02109e00)[uVar2];
    do {
      setupSharedStorageBuffer(this,attribute,buffers,(GLuint)ppuVar3);
      attribute = attribute + 1;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (sVar1 == Depth) {
    setupSharedStorageBuffer(this,getAttributes::depth_attributes,buffers,(GLuint)ppuVar3);
    return;
  }
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::setupSharedStorageBuffers(const formatDefinition& format,
																const samplingFunction& sampling_function,
																const bufferCollection& buffers, glw::GLuint program_id)
{
	const attributeDefinition* format_attributes	= 0;
	glw::GLuint				   n_format_attributes  = 0;
	glw::GLuint				   n_routine_attributes = 0;
	const attributeDefinition* routine_attributes   = 0;

	getAttributes(format.m_sampler_type, format_attributes, n_format_attributes);
	getAttributes(sampling_function, routine_attributes, n_routine_attributes);

	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		setupSharedStorageBuffer(routine_attributes[i], buffers, program_id);
	}

	for (glw::GLuint i = 0; i < n_format_attributes; ++i)
	{
		setupSharedStorageBuffer(format_attributes[i], buffers, program_id);
	}
}